

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XSDDOMParser::startElement
          (XSDDOMParser *this,XMLElementDecl *elemDecl,uint urlId,XMLCh *elemPrefix,
          RefVectorOf<xercesc_4_0::XMLAttr> *attrList,XMLSize_t attrCount,bool isEmpty,bool isRoot)

{
  XMLBufferMgr *pXVar1;
  int iVar2;
  XMLScanner *pXVar3;
  DOMDocumentImpl *pDVar4;
  DOMNode *pDVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLAttr *this_00;
  XMLCh *pXVar9;
  XMLCh *pXVar10;
  DOMAttr *attr;
  long *plVar11;
  DOMNodeIDMap *this_01;
  undefined4 extraout_var_05;
  ulong uVar12;
  long *plVar13;
  long *plVar14;
  long *plVar15;
  DOMDocument *doc;
  XMLSize_t i;
  ulong uVar16;
  XMLSize_t index;
  XMLSize_t getAt;
  DOMNode *local_60;
  XMLBufBid elemQName;
  int colonPos;
  XMLCh *local_38;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  
  iVar2 = this->fDepth;
  iVar7 = iVar2 + 1;
  this->fDepth = iVar7;
  if (this->fAnnotationDepth == -1) {
    bVar6 = XMLString::equals(elemDecl->fElementName->fLocalPart,
                              (XMLCh *)SchemaSymbols::fgELT_ANNOTATION);
    if (bVar6) {
      pXVar9 = XercesDOMParser::getURIText(&this->super_XercesDOMParser,urlId);
      bVar6 = XMLString::equals(pXVar9,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
      if (bVar6) {
        this->fAnnotationDepth = this->fDepth;
        startAnnotation(this,elemDecl,attrList,attrCount);
      }
    }
  }
  else {
    if (iVar2 != this->fAnnotationDepth) {
      startAnnotationElement(this,elemDecl,attrList,attrCount);
      if (!isEmpty) {
        return;
      }
      (*(this->super_XercesDOMParser).super_AbstractDOMParser.super_XMLDocumentHandler.
        _vptr_XMLDocumentHandler[6])(this,elemDecl,(ulong)urlId,(ulong)isRoot,elemPrefix);
      return;
    }
    this->fInnerAnnotationDepth = iVar7;
    startAnnotationElement(this,elemDecl,attrList,attrCount);
  }
  pXVar3 = (this->super_XercesDOMParser).super_AbstractDOMParser.fScanner;
  local_38 = elemPrefix;
  if (pXVar3->fEmptyNamespaceId == urlId) {
    iVar7 = (*(this->super_XercesDOMParser).super_AbstractDOMParser.super_XMLDocumentHandler.
              _vptr_XMLDocumentHandler[0x2f])(this,0,elemDecl->fElementName->fLocalPart);
    local_60 = (DOMNode *)CONCAT44(extraout_var,iVar7);
  }
  else if ((elemPrefix == (XMLCh *)0x0) || (*elemPrefix == L'\0')) {
    pXVar9 = XMLScanner::getURIText(pXVar3,urlId);
    iVar7 = (*(this->super_XercesDOMParser).super_AbstractDOMParser.super_XMLDocumentHandler.
              _vptr_XMLDocumentHandler[0x2f])(this,pXVar9,elemDecl->fElementName->fLocalPart);
    local_60 = (DOMNode *)CONCAT44(extraout_var_01,iVar7);
  }
  else {
    pXVar1 = &(this->super_XercesDOMParser).super_AbstractDOMParser.fBufMgr;
    elemQName.fBuffer = XMLBufferMgr::bidOnBuffer(pXVar1);
    elemQName.fMgr = pXVar1;
    XMLBuffer::set(elemQName.fBuffer,elemPrefix,0);
    XMLBuffer::append(elemQName.fBuffer,L':');
    XMLBuffer::append(elemQName.fBuffer,elemDecl->fElementName->fLocalPart);
    pXVar9 = XMLScanner::getURIText
                       ((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner,urlId);
    (elemQName.fBuffer)->fBuffer[(elemQName.fBuffer)->fIndex] = L'\0';
    iVar7 = (*(this->super_XercesDOMParser).super_AbstractDOMParser.super_XMLDocumentHandler.
              _vptr_XMLDocumentHandler[0x2f])(this,pXVar9);
    local_60 = (DOMNode *)CONCAT44(extraout_var_00,iVar7);
    XMLBufBid::~XMLBufBid(&elemQName);
  }
  for (getAt = 0; attrCount != getAt; getAt = getAt + 1) {
    this_00 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                        (&attrList->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,getAt);
    uVar8 = this_00->fAttName->fURIId;
    bVar6 = XMLString::equals(this_00->fAttName->fLocalPart,(XMLCh *)XMLUni::fgXMLNSString);
    pXVar3 = (this->super_XercesDOMParser).super_AbstractDOMParser.fScanner;
    if (bVar6) {
      uVar8 = pXVar3->fXMLNSNamespaceId;
    }
    if (uVar8 == pXVar3->fEmptyNamespaceId) {
      pXVar9 = (XMLCh *)0x0;
    }
    else {
      pXVar9 = XMLScanner::getURIText(pXVar3,uVar8);
    }
    pDVar4 = (this->super_XercesDOMParser).super_AbstractDOMParser.fDocument;
    pXVar10 = XMLAttr::getQName(this_00);
    iVar7 = (*(pDVar4->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x53])(pDVar4,pXVar9,pXVar10);
    attr = (DOMAttr *)CONCAT44(extraout_var_02,iVar7);
    (*(attr->super_DOMNode)._vptr_DOMNode[0x2b])(attr,this_00->fValue);
    iVar7 = (*local_60->_vptr_DOMNode[0x34])(local_60,attr);
    plVar11 = (long *)CONCAT44(extraout_var_03,iVar7);
    if (plVar11 != (long *)0x0) {
      (**(code **)(*plVar11 + 0x138))(plVar11);
    }
    if (this_00->fType == ID) {
      pDVar4 = (this->super_XercesDOMParser).super_AbstractDOMParser.fDocument;
      this_01 = pDVar4->fNodeIDMap;
      if (this_01 == (DOMNodeIDMap *)0x0) {
        iVar7 = (*(pDVar4->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])(pDVar4,0x30);
        this_01 = (DOMNodeIDMap *)CONCAT44(extraout_var_04,iVar7);
        pDVar4 = (this->super_XercesDOMParser).super_AbstractDOMParser.fDocument;
        doc = &pDVar4->super_DOMDocument;
        if (pDVar4 == (DOMDocumentImpl *)0x0) {
          doc = (DOMDocument *)0x0;
        }
        DOMNodeIDMap::DOMNodeIDMap(this_01,500,doc);
        ((this->super_XercesDOMParser).super_AbstractDOMParser.fDocument)->fNodeIDMap = this_01;
      }
      DOMNodeIDMap::add(this_01,attr);
      *(ushort *)&attr[5].super_DOMNode._vptr_DOMNode =
           *(ushort *)&attr[5].super_DOMNode._vptr_DOMNode | 0x100;
    }
    (*(attr->super_DOMNode)._vptr_DOMNode[0x33])(attr,(ulong)this_00->fSpecified);
  }
  iVar7 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[7])(elemDecl);
  if ((char)iVar7 != '\0') {
    iVar7 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[5])(elemDecl);
    plVar11 = (long *)CONCAT44(extraout_var_05,iVar7);
    pXVar1 = &(this->super_XercesDOMParser).super_AbstractDOMParser.fBufMgr;
    for (uVar16 = 0; uVar12 = (**(code **)(*plVar11 + 0x50))(plVar11), uVar16 < uVar12;
        uVar16 = uVar16 + 1) {
      plVar13 = (long *)(**(code **)(*plVar11 + 0x58))(plVar11,uVar16);
      if (*(uint *)(plVar13 + 1) < 2) {
        pXVar9 = (XMLCh *)(**(code **)(*plVar13 + 0x28))(plVar13);
        elemQName.fBuffer = XMLBufferMgr::bidOnBuffer(pXVar1);
        colonPos = -1;
        elemQName.fMgr = pXVar1;
        uVar8 = XMLScanner::resolveQName
                          ((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner,pXVar9,
                           elemQName.fBuffer,Mode_Attribute,&colonPos);
        bVar6 = XMLString::equals(pXVar9,(XMLCh *)XMLUni::fgXMLNSString);
        pXVar3 = (this->super_XercesDOMParser).super_AbstractDOMParser.fScanner;
        if (bVar6) {
          uVar8 = pXVar3->fXMLNSNamespaceId;
        }
        if (uVar8 == pXVar3->fEmptyNamespaceId) {
          pXVar10 = (XMLCh *)0x0;
        }
        else {
          pXVar10 = XMLScanner::getURIText(pXVar3,uVar8);
        }
        pDVar4 = (this->super_XercesDOMParser).super_AbstractDOMParser.fDocument;
        iVar7 = (*(pDVar4->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x53])
                          (pDVar4,pXVar10,pXVar9);
        plVar14 = (long *)CONCAT44(extraout_var_06,iVar7);
        iVar7 = (*local_60->_vptr_DOMNode[0x49])(local_60,plVar14);
        plVar15 = (long *)CONCAT44(extraout_var_07,iVar7);
        if (plVar15 != (long *)0x0) {
          (**(code **)(*plVar15 + 0x138))(plVar15);
        }
        if (plVar13[4] != 0) {
          (**(code **)(*plVar14 + 0x158))(plVar14);
          (**(code **)(*plVar14 + 0x198))(plVar14,0);
        }
        XMLBufBid::~XMLBufBid(&elemQName);
      }
      (**(code **)(*plVar13 + 0x30))(plVar13);
    }
  }
  pDVar5 = (this->super_XercesDOMParser).super_AbstractDOMParser.fCurrentParent;
  (*pDVar5->_vptr_DOMNode[0x11])(pDVar5,local_60);
  (this->super_XercesDOMParser).super_AbstractDOMParser.fCurrentParent = local_60;
  (this->super_XercesDOMParser).super_AbstractDOMParser.fCurrentNode = local_60;
  (this->super_XercesDOMParser).super_AbstractDOMParser.fWithinElement = true;
  if (isEmpty) {
    (*(this->super_XercesDOMParser).super_AbstractDOMParser.super_XMLDocumentHandler.
      _vptr_XMLDocumentHandler[6])(this,elemDecl,(ulong)urlId,(ulong)isRoot,local_38);
  }
  return;
}

Assistant:

void XSDDOMParser::startElement( const XMLElementDecl&       elemDecl
                               , const unsigned int          urlId
                               , const XMLCh* const          elemPrefix
                               , const RefVectorOf<XMLAttr>& attrList
                               , const XMLSize_t             attrCount
                               , const bool                  isEmpty
                               , const bool                  isRoot)
{
    fDepth++;

    // while it is true that non-whitespace character data
    // may only occur in appInfo or documentation
    // elements, it's certainly legal for comments and PI's to
    // occur as children of annotation; we need
    // to account for these here.
    if (fAnnotationDepth == -1)
    {
        if (XMLString::equals(elemDecl.getBaseName(), SchemaSymbols::fgELT_ANNOTATION) &&
            XMLString::equals(getURIText(urlId), SchemaSymbols::fgURI_SCHEMAFORSCHEMA))
        {

            fAnnotationDepth = fDepth;
            startAnnotation(elemDecl, attrList, attrCount);
        }
    }
    else if (fDepth == fAnnotationDepth+1)
    {
        fInnerAnnotationDepth = fDepth;
        startAnnotationElement(elemDecl, attrList, attrCount);
    }
    else
    {
        startAnnotationElement(elemDecl, attrList, attrCount);
        if(isEmpty)
            endElement(elemDecl, urlId, isRoot, elemPrefix);
        // avoid falling through; don't call startElement in this case
        return;
    }

    DOMElement *elem;
    if (urlId != fScanner->getEmptyNamespaceId())  //TagName has a prefix
    {
        if (elemPrefix && *elemPrefix)
        {
            XMLBufBid elemQName(&fBufMgr);
            elemQName.set(elemPrefix);
            elemQName.append(chColon);
            elemQName.append(elemDecl.getBaseName());
            elem = createElementNSNode(
                fScanner->getURIText(urlId), elemQName.getRawBuffer());
        }
        else {
            elem = createElementNSNode(
                fScanner->getURIText(urlId), elemDecl.getBaseName());
        }
    }
    else {
        elem = createElementNSNode(0, elemDecl.getBaseName());
    }

    DOMElementImpl *elemImpl = (DOMElementImpl *) elem;
    for (XMLSize_t index = 0; index < attrCount; ++index)
    {
        const XMLAttr* oneAttrib = attrList.elementAt(index);
        unsigned int attrURIId = oneAttrib->getURIId();
        const XMLCh* namespaceURI = 0;

        //for xmlns=...
        if (XMLString::equals(oneAttrib->getName(), XMLUni::fgXMLNSString))
            attrURIId = fScanner->getXMLNSNamespaceId();

        //TagName has a prefix
        if (attrURIId != fScanner->getEmptyNamespaceId())
            namespaceURI = fScanner->getURIText(attrURIId); //get namespaceURI

        //  revisit.  Optimize to init the named node map to the
        //            right size up front.
        DOMAttrImpl *attr = (DOMAttrImpl *)
            fDocument->createAttributeNS(namespaceURI, oneAttrib->getQName());
        attr->setValue(oneAttrib -> getValue());
        DOMNode* remAttr = elemImpl->setAttributeNodeNS(attr);
        if (remAttr)
            remAttr->release();

        // Attributes of type ID.  If this is one, add it to the hashtable of IDs
        //   that is constructed for use by GetElementByID().
        if (oneAttrib->getType()==XMLAttDef::ID)
        {
            if (fDocument->fNodeIDMap == 0)
                fDocument->fNodeIDMap = new (fDocument) DOMNodeIDMap(500, fDocument);
            fDocument->fNodeIDMap->add(attr);
            attr->fNode.isIdAttr(true);
        }

        attr->setSpecified(oneAttrib->getSpecified());
    }

    // set up the default attributes
    if (elemDecl.hasAttDefs())
	{
        XMLAttDefList* defAttrs = &elemDecl.getAttDefList();
        XMLAttDef* attr = 0;
        DOMAttrImpl * insertAttr = 0;

        for (XMLSize_t i=0; i<defAttrs->getAttDefCount(); i++)
        {
            attr = &defAttrs->getAttDef(i);

            const XMLAttDef::DefAttTypes defType = attr->getDefaultType();
            if ((defType == XMLAttDef::Default)
            ||  (defType == XMLAttDef::Fixed))
            {
                // DOM Level 2 wants all namespace declaration attributes
                // to be bound to "http://www.w3.org/2000/xmlns/"
                // So as long as the XML parser doesn't do it, it needs to
                // done here.
                const XMLCh* qualifiedName = attr->getFullName();
                XMLBufBid bbPrefixQName(&fBufMgr);
                XMLBuffer& prefixBuf = bbPrefixQName.getBuffer();
                int colonPos = -1;
                unsigned int uriId = fScanner->resolveQName(qualifiedName, prefixBuf, ElemStack::Mode_Attribute, colonPos);

                const XMLCh* namespaceURI = 0;
                if (XMLString::equals(qualifiedName, XMLUni::fgXMLNSString))
                    uriId = fScanner->getXMLNSNamespaceId();

                //TagName has a prefix
                if (uriId != fScanner->getEmptyNamespaceId())
                    namespaceURI = fScanner->getURIText(uriId);

                insertAttr = (DOMAttrImpl *) fDocument->createAttributeNS(
                    namespaceURI, qualifiedName);

                DOMAttr* remAttr = elemImpl->setDefaultAttributeNodeNS(insertAttr);
                if (remAttr)
                    remAttr->release();

                if (attr->getValue() != 0)
                {
                    insertAttr->setValue(attr->getValue());
                    insertAttr->setSpecified(false);
                }
            }

            insertAttr = 0;
            attr->reset();
        }
    }

    fCurrentParent->appendChild(elem);
    fCurrentParent = elem;
    fCurrentNode = elem;
    fWithinElement = true;

    // If an empty element, do end right now (no endElement() will be called)
    if (isEmpty)
        endElement(elemDecl, urlId, isRoot, elemPrefix);
}